

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O2

int Spl_ManCountMarkedFanins(Gia_Man_t *p,int iObj,Vec_Bit_t *vMarks)

{
  int iVar1;
  Vec_Int_t *p_00;
  int iVar2;
  int i;
  
  p_00 = Gia_ObjLutFanins2(p,iObj);
  iVar2 = 0;
  for (i = 0; i < p_00->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(p_00,i);
    iVar1 = Vec_BitEntry(vMarks,iVar1);
    iVar2 = iVar2 + iVar1;
  }
  return iVar2;
}

Assistant:

int Spl_ManCountMarkedFanins( Gia_Man_t * p, int iObj, Vec_Bit_t * vMarks )
{
    int i, iFan, Count = 0;
    Vec_Int_t * vFanins = Gia_ObjLutFanins2(p, iObj);
    Vec_IntForEachEntry( vFanins, iFan, i )
        if ( Vec_BitEntry(vMarks, iFan) )
            Count++;
    return Count;
}